

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

string * __thiscall
cs_impl::any::holder<cs::range_type>::to_string_abi_cxx11_(holder<cs::range_type> *this)

{
  string *in_RDI;
  range_type *in_stack_00000138;
  
  to_string<cs::range_type>(in_stack_00000138);
  return in_RDI;
}

Assistant:

std::string to_string() const override
			{
				return cs_impl::to_string(mDat);
			}